

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlFloat.cpp
# Opt level: O0

filepos_t __thiscall
libebml::EbmlFloat::RenderData(EbmlFloat *this,IOCallback *output,bool param_2,bool param_3)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int *Buffer;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *Buffer_00;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  bool bVar2;
  undefined1 local_50 [8];
  big_int64 TmpToWrite_1;
  int64 Tmp_1;
  double val_1;
  big_int32 TmpToWrite;
  int Tmp;
  float val;
  bool param_3_local;
  bool param_2_local;
  IOCallback *output_local;
  EbmlFloat *this_local;
  
  iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
  bVar2 = true;
  if (CONCAT44(extraout_var,iVar1) != 4) {
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
    bVar2 = CONCAT44(extraout_var_00,iVar1) == 8;
  }
  if (bVar2) {
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
    if (CONCAT44(extraout_var_01,iVar1) == 4) {
      TmpToWrite.platform_value = (int)(float)this->Value;
      TmpToWrite.endian_value = TmpToWrite.platform_value;
      Endian<int,_(libebml::endianess)0>::Endian
                ((Endian<int,_(libebml::endianess)0> *)((long)&val_1 + 4),TmpToWrite.platform_value)
      ;
      Buffer = Endian<int,_(libebml::endianess)0>::endian
                         ((Endian<int,_(libebml::endianess)0> *)((long)&val_1 + 4));
      iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
      IOCallback::writeFully(output,Buffer,CONCAT44(extraout_var_02,iVar1));
    }
    else {
      iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
      if (CONCAT44(extraout_var_03,iVar1) == 8) {
        TmpToWrite_1.endian_value = (long)this->Value;
        Endian<long,_(libebml::endianess)0>::Endian
                  ((Endian<long,_(libebml::endianess)0> *)local_50,TmpToWrite_1.endian_value);
        Buffer_00 = Endian<long,_(libebml::endianess)0>::endian
                              ((Endian<long,_(libebml::endianess)0> *)local_50);
        iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
        IOCallback::writeFully(output,Buffer_00,CONCAT44(extraout_var_04,iVar1));
      }
    }
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
    return CONCAT44(extraout_var_05,iVar1);
  }
  __assert_fail("GetSize() == 4 || GetSize() == 8",
                "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlFloat.cpp"
                ,0x5b,"virtual filepos_t libebml::EbmlFloat::RenderData(IOCallback &, bool, bool)");
}

Assistant:

filepos_t EbmlFloat::RenderData(IOCallback & output, bool /* bForceRender */, bool /* bWithDefault */)
{
  assert(GetSize() == 4 || GetSize() == 8);

  if (GetSize() == 4) {
    float val = Value;
    int Tmp;
    memcpy(&Tmp, &val, 4);
    big_int32 TmpToWrite(Tmp);
    output.writeFully(&TmpToWrite.endian(), GetSize());
  } else if (GetSize() == 8) {
    double val = Value;
    int64 Tmp;
    memcpy(&Tmp, &val, 8);
    big_int64 TmpToWrite(Tmp);
    output.writeFully(&TmpToWrite.endian(), GetSize());
  }

  return GetSize();
}